

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall
InterpGCTest_Collect_TableCycle_Test::TestBody(InterpGCTest_Collect_TableCycle_Test *this)

{
  Store *this_00;
  bool bVar1;
  char *pcVar2;
  Ptr t2;
  Ptr t1;
  Ptr t3;
  AssertionResult gtest_ar;
  Index after_new;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  RefPtr<wabt::interp::Table> local_128;
  RefPtr<wabt::interp::Table> local_108;
  RefPtr<wabt::interp::Table> local_e8;
  internal local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  AssertHelper local_b8;
  unsigned_long local_b0;
  TableType local_a8;
  TableType local_80;
  TableType local_58;
  
  this_00 = &(this->super_InterpGCTest).super_InterpTest.store_;
  local_58.super_ExternType.kind = Table;
  local_58.super_ExternType._12_4_ = 0xffffffef;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfb90;
  local_58.limits.initial = 2;
  local_58.limits.max = 0xffffffff;
  local_58.limits.has_max = false;
  local_58.limits.is_shared = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_108,this_00,this_00,&local_58);
  local_80.super_ExternType.kind = Table;
  local_80.super_ExternType._12_4_ = 0xffffffef;
  local_80.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfb90;
  local_80.limits.initial = 2;
  local_80.limits.max = 0xffffffff;
  local_80.limits.has_max = false;
  local_80.limits.is_shared = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_128,this_00,this_00,&local_80);
  local_a8.super_ExternType.kind = Table;
  local_a8.super_ExternType._12_4_ = 0xffffffef;
  local_a8.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002cfb90;
  local_a8.limits.initial = 2;
  local_a8.limits.max = 0xffffffff;
  local_a8.limits.has_max = false;
  local_a8.limits.is_shared = false;
  wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
            (&local_e8,this_00,this_00,&local_a8);
  wabt::interp::Table::Set
            (local_108.obj_,this_00,0,(Ref)((local_108.obj_)->super_Extern).super_Object.self_.index
            );
  wabt::interp::Table::Set
            (local_128.obj_,this_00,0,(Ref)((local_e8.obj_)->super_Extern).super_Object.self_.index)
  ;
  wabt::interp::Table::Set
            (local_e8.obj_,this_00,0,(Ref)((local_128.obj_)->super_Extern).super_Object.self_.index)
  ;
  wabt::interp::Table::Set
            (local_e8.obj_,this_00,1,(Ref)((local_108.obj_)->super_Extern).super_Object.self_.index)
  ;
  local_b0 = ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                             super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                             ._M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                    super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) -
             ((long)*(pointer *)
                     ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) -
              (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
  local_130.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_InterpGCTest).before_new + 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_c8,"before_new + 3","after_new",(unsigned_long *)&local_130,&local_b0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x25c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_130.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_130.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_130.ptr_ + 8))();
      }
      local_130.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_108.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_108.store_,local_108.root_index_);
    local_108.obj_ = (Table *)0x0;
    local_108.store_ = (Store *)0x0;
    local_108.root_index_ = 0;
  }
  if (local_128.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_128.store_,local_128.root_index_);
    local_128.obj_ = (Table *)0x0;
    local_128.store_ = (Store *)0x0;
    local_128.root_index_ = 0;
  }
  wabt::interp::Store::Collect(this_00);
  local_130.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)*(pointer *)
                ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
                        super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
                        ._M_impl + 8) -
         (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.list_.
               super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) -
       ((long)*(pointer *)
               ((long)&(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               ) -
        (long)(this->super_InterpGCTest).super_InterpTest.store_.objects_.free_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3));
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_c8,"after_new","store_.object_count()",&local_b0,(unsigned_long *)&local_130);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_130);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x262,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_130.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_130.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_130.ptr_ + 8))();
      }
      local_130.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_e8.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_e8.store_,local_e8.root_index_);
    local_e8.obj_ = (Table *)0x0;
    local_e8.store_ = (Store *)0x0;
    local_e8.root_index_ = 0;
  }
  if (local_e8.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_e8.store_,local_e8.root_index_);
    local_e8.obj_ = (Table *)0x0;
    local_e8.store_ = (Store *)0x0;
    local_e8.root_index_ = 0;
  }
  if (local_128.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_128.store_,local_128.root_index_);
    local_128.obj_ = (Table *)0x0;
    local_128.store_ = (Store *)0x0;
    local_128.root_index_ = 0;
  }
  if (local_108.obj_ != (Table *)0x0) {
    wabt::interp::Store::DeleteRoot(local_108.store_,local_108.root_index_);
  }
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_TableCycle) {
  auto tt = TableType{ValueType::Anyref, Limits{2}};
  auto t1 = Table::New(store_, tt);
  auto t2 = Table::New(store_, tt);
  auto t3 = Table::New(store_, tt);

  t1->Set(store_, 0, t1->self());  // t1 references itself.
  t2->Set(store_, 0, t3->self());
  t3->Set(store_, 0, t2->self());  // t2 and t3 reference each other.
  t3->Set(store_, 1, t1->self());  // t3 also references t1.

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 3, after_new);

  // Remove t1 and t2 roots, but their kept alive by t3.
  t1.reset();
  t2.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove t3 root, now all should be removed.
  t3.reset();
}